

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

cbtMatrix3x3 * __thiscall cbtMatrix3x3::scaled(cbtMatrix3x3 *this,cbtVector3 *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  cbtMatrix3x3 *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar1 = s->m_floats[2];
  uVar5 = *(undefined8 *)this->m_el[0].m_floats;
  fVar2 = this->m_el[0].m_floats[2];
  fVar3 = this->m_el[1].m_floats[2];
  fVar4 = this->m_el[2].m_floats[2];
  fVar6 = (float)*(undefined8 *)s->m_floats;
  auVar10._0_4_ = (float)uVar5 * fVar6;
  fVar7 = (float)((ulong)*(undefined8 *)s->m_floats >> 0x20);
  auVar10._4_4_ = (float)((ulong)uVar5 >> 0x20) * fVar7;
  auVar10._8_8_ = 0;
  uVar5 = vmovlps_avx(auVar10);
  *(undefined8 *)in_RDI->m_el[0].m_floats = uVar5;
  in_RDI->m_el[0].m_floats[2] = fVar1 * fVar2;
  in_RDI->m_el[0].m_floats[3] = 0.0;
  uVar5 = *(undefined8 *)this->m_el[1].m_floats;
  auVar8._0_4_ = fVar6 * (float)uVar5;
  auVar8._4_4_ = fVar7 * (float)((ulong)uVar5 >> 0x20);
  auVar8._8_8_ = 0;
  uVar5 = vmovlps_avx(auVar8);
  *(undefined8 *)in_RDI->m_el[1].m_floats = uVar5;
  in_RDI->m_el[1].m_floats[2] = fVar1 * fVar3;
  in_RDI->m_el[1].m_floats[3] = 0.0;
  uVar5 = *(undefined8 *)this->m_el[2].m_floats;
  auVar9._0_4_ = fVar6 * (float)uVar5;
  auVar9._4_4_ = fVar7 * (float)((ulong)uVar5 >> 0x20);
  auVar9._8_8_ = 0;
  uVar5 = vmovlps_avx(auVar9);
  *(undefined8 *)in_RDI->m_el[2].m_floats = uVar5;
  in_RDI->m_el[2].m_floats[2] = fVar1 * fVar4;
  in_RDI->m_el[2].m_floats[3] = 0.0;
  return in_RDI;
}

Assistant:

cbtMatrix3x3 scaled(const cbtVector3& s) const
	{
#if (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)) || defined(BT_USE_NEON)
		return cbtMatrix3x3(m_el[0] * s, m_el[1] * s, m_el[2] * s);
#else
		return cbtMatrix3x3(
			m_el[0].x() * s.x(), m_el[0].y() * s.y(), m_el[0].z() * s.z(),
			m_el[1].x() * s.x(), m_el[1].y() * s.y(), m_el[1].z() * s.z(),
			m_el[2].x() * s.x(), m_el[2].y() * s.y(), m_el[2].z() * s.z());
#endif
	}